

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,double_writer f)

{
  wchar_t wVar1;
  alignment aVar2;
  unsigned_long __n;
  char *pcVar3;
  size_t left_padding;
  size_t padding;
  type pcStack_40;
  char_type fill;
  char **local_38;
  type *it;
  uint local_24;
  align_spec *paStack_20;
  uint width;
  align_spec *spec_local;
  size_t size_local;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this_local;
  
  paStack_20 = spec;
  spec_local = (align_spec *)size;
  size_local = (size_t)this;
  local_24 = align_spec::width(spec);
  if (spec_local < (align_spec *)(ulong)local_24) {
    pcStack_40 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
                 reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                          *)this,(ulong)local_24);
    local_38 = &stack0xffffffffffffffc0;
    wVar1 = align_spec::fill(paStack_20);
    padding._7_1_ = (undefined1)wVar1;
    __n = (ulong)local_24 - (long)spec_local;
    aVar2 = align_spec::align(paStack_20);
    if (aVar2 == ALIGN_RIGHT) {
      pcVar3 = std::fill_n<char*,unsigned_long,char>(*local_38,__n,(char *)((long)&padding + 7));
      *local_38 = pcVar3;
      double_writer::operator()((double_writer *)&f,local_38);
    }
    else {
      aVar2 = align_spec::align(paStack_20);
      if (aVar2 == ALIGN_CENTER) {
        pcVar3 = std::fill_n<char*,unsigned_long,char>
                           (*local_38,__n >> 1,(char *)((long)&padding + 7));
        *local_38 = pcVar3;
        double_writer::operator()((double_writer *)&f,local_38);
        pcVar3 = std::fill_n<char*,unsigned_long,char>
                           (*local_38,__n - (__n >> 1),(char *)((long)&padding + 7));
        *local_38 = pcVar3;
      }
      else {
        double_writer::operator()((double_writer *)&f,local_38);
        pcVar3 = std::fill_n<char*,unsigned_long,char>(*local_38,__n,(char *)((long)&padding + 7));
        *local_38 = pcVar3;
      }
    }
  }
  else {
    it = (type *)basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
                 reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                          *)this,(size_t)spec_local);
    double_writer::operator()((double_writer *)&f,(char **)&it);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}